

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O2

bool_t prf_state_texture_lookup(prf_state_t *state,uint index,prf_texture_t *texture)

{
  uint8_t *__src;
  uint uVar1;
  ulong uVar2;
  
  uVar1 = prf_array_count(state->textures);
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  uVar2 = 0;
  do {
    if (uVar1 == uVar2) {
      return 0;
    }
    __src = state->textures[uVar2]->data;
    uVar2 = uVar2 + 1;
  } while (*(uint *)(__src + 200) != index);
  memcpy(texture,__src,0xd4);
  return 1;
}

Assistant:

bool_t
prf_state_texture_lookup(
    prf_state_t * state,
    unsigned int index,
    prf_texture_t * texture )
{
    int count, i;
    assert( state != NULL && texture != NULL );
    count = prf_array_count( state->textures );
    for ( i = 0; i < count; i++ ) {
        prf_node_t *node;
        prf_texture_t *tex;
        node = state->textures[i];
        tex = (prf_texture_t *) node->data;
        if ( (unsigned int) tex->pattern_index == index ) {
            memcpy(texture, tex, sizeof( prf_texture_t ) );
            return TRUE;
        }
    }
    return FALSE;
}